

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<bool(int),std::tuple<trompeloeil::wildcard>>::
set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
          (call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> *this,
          pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  type __args_1;
  __single_object seq;
  pair<const_char_*,_trompeloeil::sequence_&> *t_local;
  call_matcher<bool_(int),_std::tuple<trompeloeil::wildcard>_> *this_local;
  
  seq._M_t.
  super___uniq_ptr_impl<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::sequence_handler<1UL>_*,_std::default_delete<trompeloeil::sequence_handler<1UL>_>_>
  .super__Head_base<0UL,_trompeloeil::sequence_handler<1UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>,_true,_true>
        )(__uniq_ptr_data<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>,_true,_true>
          )t;
  __args_1 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator*((unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
                          *)(this + 0x70));
  std::
  make_unique<trompeloeil::sequence_handler<1ul>,trompeloeil::sequence_handler_base&,char_const*&,trompeloeil::location&,std::pair<char_const*,trompeloeil::sequence&>>
            ((sequence_handler_base *)&stack0xffffffffffffffe0,(char **)__args_1,
             (location *)(this + 0x28),(pair<const_char_*,_trompeloeil::sequence_&> *)(this + 0x18))
  ;
  std::
  unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
  ::operator=((unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
               *)(this + 0x70),
              (unique_ptr<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>_>
               *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>_>
  ::~unique_ptr((unique_ptr<trompeloeil::sequence_handler<1UL>,_std::default_delete<trompeloeil::sequence_handler<1UL>_>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
    set_sequence(
      T&& ... t)
    {
      using handler = sequence_handler<sizeof...(T)>;
      auto seq = detail::make_unique<handler>(*sequences,
                                              name,
                                              loc,
                                              std::forward<T>(t)...);
      sequences = std::move(seq);
    }